

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void gl4cts::TextureViewUtilities::getComponentSizeForType(GLenum type,uint *out_rgba_size)

{
  TestError *this;
  uint *out_rgba_size_local;
  GLenum type_local;
  
  out_rgba_size[0] = 0;
  out_rgba_size[1] = 0;
  out_rgba_size[2] = 0;
  out_rgba_size[3] = 0;
  if (type - 0x1400 < 2) {
    *out_rgba_size = 8;
    out_rgba_size[1] = 8;
    out_rgba_size[2] = 8;
    out_rgba_size[3] = 8;
    return;
  }
  if (1 < type - 0x1402) {
    if (type - 0x1404 < 3) {
      *out_rgba_size = 0x20;
      out_rgba_size[1] = 0x20;
      out_rgba_size[2] = 0x20;
      out_rgba_size[3] = 0x20;
      return;
    }
    if (type != 0x140b) {
      if (type == 0x8036) {
        *out_rgba_size = 10;
        out_rgba_size[1] = 10;
        out_rgba_size[2] = 10;
        out_rgba_size[3] = 2;
        return;
      }
      if (type == 0x8368) {
        *out_rgba_size = 10;
        out_rgba_size[1] = 10;
        out_rgba_size[2] = 10;
        out_rgba_size[3] = 2;
        return;
      }
      if (type == 0x84fa) {
        *out_rgba_size = 0x18;
        out_rgba_size[1] = 8;
        out_rgba_size[2] = 0;
        out_rgba_size[3] = 0;
        return;
      }
      if (type != 0x8c3b) {
        if (type == 0x8c3e) {
          *out_rgba_size = 9;
          out_rgba_size[1] = 9;
          out_rgba_size[2] = 9;
          out_rgba_size[3] = 5;
          return;
        }
        if (type == 0x8dad) {
          *out_rgba_size = 8;
          out_rgba_size[1] = 0x18;
          out_rgba_size[2] = 0x20;
          out_rgba_size[3] = 0;
          return;
        }
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Unrecognized type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x2c4);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      *out_rgba_size = 0xb;
      out_rgba_size[1] = 0xb;
      out_rgba_size[2] = 10;
      return;
    }
  }
  *out_rgba_size = 0x10;
  out_rgba_size[1] = 0x10;
  out_rgba_size[2] = 0x10;
  out_rgba_size[3] = 0x10;
  return;
}

Assistant:

void TextureViewUtilities::getComponentSizeForType(const glw::GLenum type, unsigned int* out_rgba_size)
{
	memset(out_rgba_size, 0, sizeof(unsigned int) * 4 /* rgba */);

	switch (type)
	{
	case GL_BYTE:
	case GL_UNSIGNED_BYTE:
	{
		out_rgba_size[0] = 8;
		out_rgba_size[1] = 8;
		out_rgba_size[2] = 8;
		out_rgba_size[3] = 8;

		break;
	}

	case GL_FLOAT:
	case GL_UNSIGNED_INT:
	case GL_INT:
	{
		out_rgba_size[0] = 32;
		out_rgba_size[1] = 32;
		out_rgba_size[2] = 32;
		out_rgba_size[3] = 32;

		break;
	}

	case GL_FLOAT_32_UNSIGNED_INT_24_8_REV:
	{
		out_rgba_size[0] = 8;
		out_rgba_size[1] = 24;
		out_rgba_size[2] = 32;
		out_rgba_size[3] = 0;

		break;
	}

	case GL_HALF_FLOAT:
	case GL_UNSIGNED_SHORT:
	case GL_SHORT:
	{
		out_rgba_size[0] = 16;
		out_rgba_size[1] = 16;
		out_rgba_size[2] = 16;
		out_rgba_size[3] = 16;

		break;
	}

	case GL_UNSIGNED_INT_10_10_10_2:
	{
		out_rgba_size[0] = 10;
		out_rgba_size[1] = 10;
		out_rgba_size[2] = 10;
		out_rgba_size[3] = 2;

		break;
	}

	case GL_UNSIGNED_INT_10F_11F_11F_REV:
	{
		out_rgba_size[0] = 11;
		out_rgba_size[1] = 11;
		out_rgba_size[2] = 10;

		break;
	}

	case GL_UNSIGNED_INT_24_8:
	{
		out_rgba_size[0] = 24;
		out_rgba_size[1] = 8;
		out_rgba_size[2] = 0;
		out_rgba_size[3] = 0;

		break;
	}

	case GL_UNSIGNED_INT_2_10_10_10_REV:
	{
		out_rgba_size[0] = 10;
		out_rgba_size[1] = 10;
		out_rgba_size[2] = 10;
		out_rgba_size[3] = 2;

		break;
	}

	case GL_UNSIGNED_INT_5_9_9_9_REV:
	{
		out_rgba_size[0] = 9;
		out_rgba_size[1] = 9;
		out_rgba_size[2] = 9;
		out_rgba_size[3] = 5;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized type");
	}
	} /* switch (type) */
}